

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O0

string * handle_server_page_abi_cxx11_(string_view query_string)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  short sVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  const_pointer __first;
  const_pointer pvVar5;
  size_type sVar6;
  size_type sVar7;
  const_reference ppSVar8;
  Server *pSVar9;
  string *this;
  undefined8 uVar10;
  __integer_from_chars_result_type<unsigned_short> _Var11;
  string_view __y;
  allocator<char> local_199;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  __sv_type local_178;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  string_view local_158;
  size_t local_148;
  char *pcStack_140;
  size_type local_130;
  size_t index;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_110;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  errc local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  undefined1 auStack_e8 [8];
  string_view port_str;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  undefined4 local_bc;
  Server *local_b8;
  Server *server;
  undefined1 auStack_a8 [6];
  unsigned_short port;
  string_view address;
  undefined1 local_90 [8];
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  table;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string parsed_query_string;
  string_view query_string_local;
  
  parsed_query_string.field_2._8_8_ = query_string._M_len;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_40,
             (basic_string_view<char,_std::char_traits<char>_> *)
             ((long)&parsed_query_string.field_2 + 8),&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)local_90);
  jessilib::
  deserialize_html_form<char,_std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_nullptr>
            ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_a8);
  server._6_2_ = 0;
  sVar3 = std::
          unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::size((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  *)local_90);
  if (sVar3 < 2) {
    query_string_local._M_str = (char *)operator_new(0x20);
    std::__cxx11::string::string((string *)query_string_local._M_str);
    local_bc = 1;
  }
  else {
    sVar3 = std::
            unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ::size((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    *)local_90);
    if (sVar3 != 0) {
      local_d0 = sv("ip",2);
      pmVar4 = std::
               unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)local_90,&local_d0);
      _auStack_a8 = pmVar4->_M_len;
      address._M_len = (size_t)pmVar4->_M_str;
      local_f8 = sv("port",4);
      pmVar4 = std::
               unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)local_90,&local_f8);
      auStack_e8 = (undefined1  [8])pmVar4->_M_len;
      port_str._M_len = (size_t)pmVar4->_M_str;
      __first = std::basic_string_view<char,_std::char_traits<char>_>::data
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8);
      pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8);
      _Var11 = std::from_chars<unsigned_short>
                         (__first,pvVar5 + sVar6,(unsigned_short *)((long)&server + 6),10);
      servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)_Var11.ptr;
      local_100 = _Var11.ec;
    }
    RenX::getCore();
    RenX::Core::getServers();
    local_110 = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&index;
    local_130 = 0;
    while( true ) {
      sVar6 = local_130;
      sVar7 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::size(local_110);
      if (sVar6 == sVar7) break;
      ppSVar8 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::operator[]
                          (local_110,local_130);
      local_b8 = *ppSVar8;
      local_148 = _auStack_a8;
      pcStack_140 = (char *)address._M_len;
      __y = RenX_ServerListPlugin::getListServerAddress(&pluginInstance,local_b8);
      __x._M_str = pcStack_140;
      __x._M_len = local_148;
      local_158 = __y;
      bVar1 = std::operator==(__x,__y);
      if (bVar1) {
        sVar2 = RenX::Server::getPort();
        if (sVar2 == server._6_2_) {
          RenX_ServerListPlugin::touchDetails(&pluginInstance,local_b8);
          query_string_local._M_str = (char *)operator_new(0x20);
          pSVar9 = local_b8 + 0x70;
          this = (string *)Jupiter::Plugin::getName_abi_cxx11_();
          local_178 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
          uVar10 = Jupiter::Config::operator[](pSVar9,local_178._M_len,local_178._M_str);
          local_188 = sv("j",1);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198);
          local_168 = (basic_string_view<char,_std::char_traits<char>_>)
                      Jupiter::Config::get
                                (uVar10,local_188._M_len,local_188._M_str,local_198._M_len,
                                 local_198._M_str);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)query_string_local._M_str,&local_168,&local_199);
          std::allocator<char>::~allocator(&local_199);
          goto LAB_00122e88;
        }
      }
      local_130 = local_130 + 1;
    }
    query_string_local._M_str = (char *)operator_new(0x20);
    std::__cxx11::string::string((string *)query_string_local._M_str);
LAB_00122e88:
    local_bc = 1;
    std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector
              ((vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&index);
  }
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_jessilib::text_hash,_jessilib::text_equal,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return (string *)query_string_local._M_str;
}

Assistant:

std::string* handle_server_page(std::string_view query_string) {
	std::string parsed_query_string{ query_string };
	std::unordered_map<std::string_view, std::string_view, jessilib::text_hash, jessilib::text_equal> table;
	jessilib::deserialize_html_form(table, parsed_query_string);
	std::string_view address;
	unsigned short port = 0;
	RenX::Server *server;

	// parse form data

	if (table.size() < 2) {
		return new std::string();
	}

	if (table.size() != 0) {
		address = table["ip"sv];
		std::string_view port_str = table["port"sv];
		std::from_chars(port_str.data(), port_str.data() + port_str.size(), port, 10);
	}

	// search for server
	const auto& servers = RenX::getCore()->getServers();
	size_t index = 0;

	while (true) {
		if (index == servers.size())
			return new std::string();

		server = servers[index];
		if (address == pluginInstance.getListServerAddress(*server) && server->getPort() == port)
			break;

		++index;
	}

	// return server data
	pluginInstance.touchDetails(*server);
	return new std::string(server->varData[pluginInstance.getName()].get("j"sv));
}